

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalSubtyping.cpp
# Opt level: O0

void __thiscall
wasm::LocalSubtyping::doWalkFunction(wasm::Function*)::Scanner::visitLocalGet(wasm::LocalGet__
          (void *this,LocalGet *curr)

{
  bool bVar1;
  reference this_00;
  reference local_28;
  LocalGet *local_18;
  LocalGet *curr_local;
  Scanner *this_local;
  
  local_18 = curr;
  curr_local = (LocalGet *)this;
  local_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)((long)this + 0xd8),
                        (ulong)curr->index);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_28);
  if (bVar1) {
    this_00 = std::
              vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
              ::operator[]((vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                            *)((long)this + 0x118),(ulong)local_18->index);
    std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::push_back(this_00,&local_18);
  }
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
        if (relevant[curr->index]) {
          getsForLocal[curr->index].push_back(curr);
        }
      }